

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-oid.c
# Opt level: O1

void test_bson_oid_copy(void)

{
  TestSuite *pTVar1;
  char cVar2;
  int iVar3;
  undefined8 uVar4;
  time_t tVar5;
  long lVar6;
  int iVar7;
  undefined1 *puVar8;
  TestSuite *suite;
  bson_oid_t oid2;
  bson_oid_t oid;
  undefined1 auStack_98 [24];
  undefined8 uStack_80;
  long lStack_78;
  undefined1 *puStack_70;
  undefined1 auStack_58 [12];
  undefined1 auStack_4c [12];
  undefined1 *puStack_40;
  undefined1 *puStack_38;
  undefined1 auStack_28 [12];
  undefined1 local_1c [12];
  
  bson_oid_init_from_string(local_1c,"000000000000000000001234");
  bson_oid_init_from_string(auStack_28,"000000000000000000004321");
  bson_oid_copy(local_1c,auStack_28);
  cVar2 = bson_oid_equal(local_1c,auStack_28);
  if (cVar2 != '\0') {
    return;
  }
  test_bson_oid_copy_cold_1();
  puStack_40 = local_1c;
  puStack_38 = auStack_28;
  uVar4 = bson_context_new(0);
  bson_oid_init(auStack_4c,uVar4);
  bson_oid_init(auStack_58,uVar4);
  tVar5 = bson_oid_get_time_t(auStack_4c);
  puVar8 = auStack_58;
  lVar6 = bson_oid_get_time_t();
  if (tVar5 == lVar6) {
    tVar5 = time((time_t *)0x0);
    puVar8 = auStack_58;
    lVar6 = bson_oid_get_time_t();
    if (tVar5 == lVar6) {
      bson_context_destroy(uVar4);
      return;
    }
  }
  else {
    test_bson_oid_get_time_t_cold_1();
  }
  test_bson_oid_get_time_t_cold_2();
  uStack_80 = uVar4;
  lStack_78 = tVar5;
  puStack_70 = auStack_58;
  bson_oid_init(auStack_98,puVar8);
  iVar7 = 500000;
  pTVar1 = (TestSuite *)(auStack_98 + 0xc);
  while( true ) {
    bson_oid_init(pTVar1,puVar8);
    suite = pTVar1;
    cVar2 = bson_oid_equal(pTVar1,auStack_98);
    if (cVar2 != '\0') break;
    suite = pTVar1;
    iVar3 = bson_oid_compare(pTVar1,auStack_98);
    if (iVar3 < 1) goto LAB_0013486b;
    bson_oid_copy(pTVar1,auStack_98);
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      return;
    }
  }
  oid_worker_cold_2();
LAB_0013486b:
  oid_worker_cold_1();
  TestSuite_Add(suite,"/bson/reader/new_from_data",test_reader_from_data);
  TestSuite_Add(suite,"/bson/reader/new_from_data_overflow",test_reader_from_data_overflow);
  TestSuite_Add(suite,"/bson/reader/new_from_data_document_length_too_large",
                test_reader_from_data_document_length_too_large);
  TestSuite_Add(suite,"/bson/reader/new_from_data_document_length_too_small",
                test_reader_from_data_document_length_too_small);
  TestSuite_Add(suite,"/bson/reader/new_from_handle",test_reader_from_handle);
  TestSuite_Add(suite,"/bson/reader/tell",test_reader_tell);
  TestSuite_Add(suite,"/bson/reader/new_from_handle_corrupt",test_reader_from_handle_corrupt);
  TestSuite_Add(suite,"/bson/reader/grow_buffer",test_reader_grow_buffer);
  TestSuite_Add(suite,"/bson/reader/reset",test_reader_reset);
  return;
}

Assistant:

static void
test_bson_oid_copy (void)
{
   bson_oid_t oid;
   bson_oid_t oid2;

   bson_oid_init_from_string (&oid, "000000000000000000001234");
   bson_oid_init_from_string (&oid2, "000000000000000000004321");
   bson_oid_copy (&oid, &oid2);
   BSON_ASSERT (true == bson_oid_equal (&oid, &oid2));
}